

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O2

int arkLsDQJtimes(N_Vector v,N_Vector Jv,sunrealtype t,N_Vector y,N_Vector fy,void *arkode_mem,
                 N_Vector work)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  double dVar5;
  ARKLsMem arkls_mem;
  ARKodeMem ark_mem;
  
  iVar2 = arkLs_AccessARKODELMem(arkode_mem,"arkLsDQJtimes",&ark_mem,&arkls_mem);
  if (iVar2 == 0) {
    dVar5 = (double)N_VWrmsNorm(v,ark_mem->ewt);
    dVar5 = 1.0 / dVar5;
    bVar1 = true;
    iVar2 = 3;
    while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
      N_VLinearSum(dVar5,0x3ff0000000000000,v,y,work);
      iVar3 = (*arkls_mem->Jt_f)(t,work,Jv,ark_mem->user_data);
      arkls_mem->nfeDQ = arkls_mem->nfeDQ + 1;
      if (iVar3 == 0) goto LAB_0013ecfa;
      if (iVar3 < 0) {
        return -1;
      }
      dVar5 = dVar5 * 0.25;
      bVar1 = false;
    }
    if (bVar1) {
LAB_0013ecfa:
      N_VLinearSum(1.0 / dVar5,-(1.0 / dVar5),Jv,fy,Jv);
      iVar2 = 0;
    }
    else {
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

int arkLsDQJtimes(N_Vector v, N_Vector Jv, sunrealtype t, N_Vector y,
                  N_Vector fy, void* arkode_mem, N_Vector work)
{
  ARKodeMem ark_mem;
  ARKLsMem arkls_mem;
  sunrealtype sig, siginv;
  int iter, retval;

  /* access ARKodeMem and ARKLsMem structures */
  retval = arkLs_AccessARKODELMem(arkode_mem, __func__, &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Initialize perturbation to 1/||v|| */
  sig = ONE / N_VWrmsNorm(v, ark_mem->ewt);

  for (iter = 0; iter < MAX_DQITERS; iter++)
  {
    /* Set work = y + sig*v */
    N_VLinearSum(sig, v, ONE, y, work);

    /* Set Jv = f(tn, y+sig*v) */
    retval = arkls_mem->Jt_f(t, work, Jv, ark_mem->user_data);
    arkls_mem->nfeDQ++;
    if (retval == 0) { break; }
    if (retval < 0) { return (-1); }

    /* If fi failed recoverably, shrink sig and retry */
    sig *= PT25;
  }

  /* If retval still isn't 0, return with a recoverable failure */
  if (retval > 0) { return (+1); }

  /* Replace Jv by (Jv - fy)/sig */
  siginv = ONE / sig;
  N_VLinearSum(siginv, Jv, -siginv, fy, Jv);

  return (0);
}